

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O3

int TIFFReadFromUserBuffer
              (TIFF *tif,uint32_t strile,void *inbuf,tmsize_t insize,void *outbuf,tmsize_t outsize)

{
  uint uVar1;
  tmsize_t tVar2;
  uint8_t *puVar3;
  int iVar4;
  uint uVar5;
  char *fmt;
  uint uVar6;
  int iVar7;
  char *module;
  
  if (tif->tif_mode == 1) {
    module = tif->tif_name;
    fmt = "File not open for reading";
LAB_002b14dc:
    TIFFErrorExtR(tif,module,fmt);
    return 0;
  }
  uVar1 = tif->tif_flags;
  if ((uVar1 >> 0x11 & 1) != 0) {
    module = "TIFFReadFromUserBuffer";
    fmt = "Compression scheme does not support access to raw uncompressed data";
    goto LAB_002b14dc;
  }
  tVar2 = tif->tif_rawdatasize;
  puVar3 = tif->tif_rawdata;
  tif->tif_flags = (uVar1 & 0xff7dfdff) + 0x800000;
  tif->tif_rawdatasize = insize;
  tif->tif_rawdata = (uint8_t *)inbuf;
  tif->tif_rawdataoff = 0;
  tif->tif_rawdataloaded = insize;
  if ((uVar1 & 0x100) == 0 && ((uint)(tif->tif_dir).td_fillorder & uVar1 & 0xff7dfdff) == 0) {
    TIFFReverseBits((uint8_t *)inbuf,insize);
  }
  iVar4 = TIFFIsTiled(tif);
  if (iVar4 == 0) {
    uVar5 = (tif->tif_dir).td_imagelength;
    uVar6 = (tif->tif_dir).td_rowsperstrip;
    iVar4 = TIFFStartStrip(tif,strile);
    if (iVar4 != 0) {
      if (uVar5 <= uVar6) {
        uVar6 = uVar5;
      }
      iVar4 = (*tif->tif_decodestrip)
                        (tif,(uint8_t *)outbuf,outsize,
                         (uint16_t)(strile / ((uVar5 / uVar6 + 1) - (uint)(uVar5 % uVar6 == 0))));
      goto LAB_002b153e;
    }
  }
  else {
    iVar4 = TIFFStartTile(tif,strile);
    if (iVar4 != 0) {
      iVar4 = (*tif->tif_decodetile)
                        (tif,(uint8_t *)outbuf,outsize,
                         (uint16_t)(strile / (tif->tif_dir).td_stripsperimage));
LAB_002b153e:
      iVar7 = 0;
      if (iVar4 != 0) {
        (*tif->tif_postdecode)(tif,(uint8_t *)outbuf,outsize);
        iVar7 = 1;
      }
      goto LAB_002b155a;
    }
  }
  iVar7 = 0;
LAB_002b155a:
  uVar5 = tif->tif_flags;
  if ((uVar5 & ((tif->tif_dir).td_fillorder | 0x100)) == 0) {
    TIFFReverseBits((uint8_t *)inbuf,insize);
    uVar5 = tif->tif_flags;
  }
  tif->tif_flags = uVar5 & 0xff7ffdff | uVar1 & 0x800200;
  tif->tif_rawdatasize = tVar2;
  tif->tif_rawdata = puVar3;
  tif->tif_rawdataoff = 0;
  tif->tif_rawdataloaded = 0;
  return iVar7;
}

Assistant:

int TIFFReadFromUserBuffer(TIFF *tif, uint32_t strile, void *inbuf,
                           tmsize_t insize, void *outbuf, tmsize_t outsize)
{
    static const char module[] = "TIFFReadFromUserBuffer";
    TIFFDirectory *td = &tif->tif_dir;
    int ret = 1;
    uint32_t old_tif_flags = tif->tif_flags;
    tmsize_t old_rawdatasize = tif->tif_rawdatasize;
    void *old_rawdata = tif->tif_rawdata;

    if (tif->tif_mode == O_WRONLY)
    {
        TIFFErrorExtR(tif, tif->tif_name, "File not open for reading");
        return 0;
    }
    if (tif->tif_flags & TIFF_NOREADRAW)
    {
        TIFFErrorExtR(tif, module,
                      "Compression scheme does not support access to raw "
                      "uncompressed data");
        return 0;
    }

    tif->tif_flags &= ~TIFF_MYBUFFER;
    tif->tif_flags |= TIFF_BUFFERMMAP;
    tif->tif_rawdatasize = insize;
    tif->tif_rawdata = inbuf;
    tif->tif_rawdataoff = 0;
    tif->tif_rawdataloaded = insize;

    if (!isFillOrder(tif, td->td_fillorder) &&
        (tif->tif_flags & TIFF_NOBITREV) == 0)
    {
        TIFFReverseBits(inbuf, insize);
    }

    if (TIFFIsTiled(tif))
    {
        if (!TIFFStartTile(tif, strile) ||
            !(*tif->tif_decodetile)(tif, (uint8_t *)outbuf, outsize,
                                    (uint16_t)(strile / td->td_stripsperimage)))
        {
            ret = 0;
        }
    }
    else
    {
        uint32_t rowsperstrip = td->td_rowsperstrip;
        uint32_t stripsperplane;
        if (rowsperstrip > td->td_imagelength)
            rowsperstrip = td->td_imagelength;
        stripsperplane =
            TIFFhowmany_32_maxuint_compat(td->td_imagelength, rowsperstrip);
        if (!TIFFStartStrip(tif, strile) ||
            !(*tif->tif_decodestrip)(tif, (uint8_t *)outbuf, outsize,
                                     (uint16_t)(strile / stripsperplane)))
        {
            ret = 0;
        }
    }
    if (ret)
    {
        (*tif->tif_postdecode)(tif, (uint8_t *)outbuf, outsize);
    }

    if (!isFillOrder(tif, td->td_fillorder) &&
        (tif->tif_flags & TIFF_NOBITREV) == 0)
    {
        TIFFReverseBits(inbuf, insize);
    }

    tif->tif_flags = (old_tif_flags & (TIFF_MYBUFFER | TIFF_BUFFERMMAP)) |
                     (tif->tif_flags & ~(TIFF_MYBUFFER | TIFF_BUFFERMMAP));
    tif->tif_rawdatasize = old_rawdatasize;
    tif->tif_rawdata = old_rawdata;
    tif->tif_rawdataoff = 0;
    tif->tif_rawdataloaded = 0;

    return ret;
}